

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID ImGui::DockSpace(ImGuiID id,ImVec2 *size_arg,ImGuiDockNodeFlags flags,
                        ImGuiWindowClass *window_class)

{
  ImVec2 IVar1;
  int iVar2;
  ImGuiWindow *this;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  undefined8 uVar5;
  ImGuiContext *ctx;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiID IVar8;
  ImGuiID IVar9;
  ImGuiContext *g_1;
  ImGuiDockNode *node;
  uint uVar10;
  ImGuiContext *g;
  uint uVar11;
  float fVar12;
  ImVec2 size;
  char title [256];
  ImVec2 local_148;
  ImVec2 *local_140;
  undefined8 local_138;
  undefined1 uStack_130;
  undefined7 uStack_12f;
  undefined1 uStack_128;
  undefined8 uStack_127;
  
  ctx = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  IVar9 = 0;
  if (((ctx->IO).ConfigFlags & 0x40) != 0) {
    if (((uint)flags >> 10 & 1) != 0) {
      __assert_fail("(flags & ImGuiDockNodeFlags_DockSpace) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x3bef,
                    "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                   );
    }
    local_140 = size_arg;
    if (id == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x3bf0,
                    "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                   );
    }
    uVar11 = (uint)this->SkipItems | flags;
    node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,id);
    if (node == (ImGuiDockNode *)0x0) {
      node = DockContextAddNode(ctx,id);
      node->LocalFlags = 0x800;
      node->MergedFlags = node->SharedFlags | node->LocalFlagsInWindows | 0x800;
    }
    node->SharedFlags = uVar11;
    if (window_class == (ImGuiWindowClass *)0x0) {
      uStack_128 = 0;
      uStack_127 = 0;
      local_138 = 0;
      uStack_130 = 0;
      uStack_12f = 0;
      bVar7 = true;
    }
    else {
      local_138._0_4_ = window_class->ClassId;
      local_138._4_4_ = window_class->ParentViewportId;
      uVar5._0_4_ = window_class->ViewportFlagsOverrideSet;
      uVar5._4_4_ = window_class->ViewportFlagsOverrideClear;
      uStack_127 = *(undefined8 *)((long)&window_class->TabItemFlagsOverrideSet + 1);
      uStack_128 = (undefined1)
                   ((ulong)*(undefined8 *)((long)&window_class->ViewportFlagsOverrideSet + 1) >>
                   0x38);
      uStack_130 = (undefined1)(undefined4)uVar5;
      uStack_12f = (undefined7)((ulong)uVar5 >> 8);
      bVar7 = window_class->DockingAllowUnclassed;
    }
    *(ulong *)((long)&(node->WindowClass).ViewportFlagsOverrideSet + 1) =
         CONCAT17(uStack_128,uStack_12f);
    *(undefined8 *)((long)&(node->WindowClass).TabItemFlagsOverrideSet + 1) = uStack_127;
    (node->WindowClass).ClassId = (undefined4)local_138;
    (node->WindowClass).ParentViewportId = local_138._4_4_;
    (node->WindowClass).ViewportFlagsOverrideSet = (int)CONCAT71(uStack_12f,uStack_130);
    (node->WindowClass).ViewportFlagsOverrideClear = (int)((uint7)uStack_12f >> 0x18);
    (node->WindowClass).DockingAllowUnclassed = bVar7;
    iVar2 = ctx->FrameCount;
    IVar9 = id;
    if (((uVar11 & 1) == 0) && (node->LastFrameActive == iVar2)) {
      if ((node->MergedFlags & 0x400) != 0) {
        __assert_fail("node->IsDockSpace() == false && \"Cannot call DockSpace() twice a frame with the same ID\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                      ,0x3c01,
                      "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                     );
      }
      uVar11 = node->LocalFlags | 0x400;
      node->LocalFlags = uVar11;
      node->MergedFlags = node->SharedFlags | node->LocalFlagsInWindows | uVar11;
    }
    else {
      uVar10 = node->LocalFlags | 0x400;
      node->LocalFlags = uVar10;
      node->MergedFlags = node->SharedFlags | node->LocalFlagsInWindows | uVar10;
      pIVar6 = GImGui;
      if ((uVar11 & 1) == 0) {
        pIVar3 = GImGui->CurrentWindow;
        IVar1 = (pIVar3->ContentRegionRect).Max;
        fVar12 = IVar1.x;
        if (((pIVar3->DC).CurrentColumns != (ImGuiOldColumns *)0x0) ||
           (GImGui->CurrentTable != (ImGuiTable *)0x0)) {
          fVar12 = (pIVar3->WorkRect).Max.x;
        }
        local_148.x = (float)(int)local_140->x;
        local_148.y = (float)(int)local_140->y;
        if ((local_148.x <= 0.0) &&
           (local_148.x = (fVar12 - (pIVar3->DC).CursorPos.x) + local_148.x, local_148.x <= 4.0)) {
          local_148.x = 4.0;
        }
        if ((local_148.y <= 0.0) &&
           (local_148.y = (IVar1.y - (pIVar3->DC).CursorPos.y) + local_148.y, local_148.y <= 4.0)) {
          local_148.y = 4.0;
        }
        if ((local_148.x <= 0.0) || (local_148.y <= 0.0)) {
          __assert_fail("size.x > 0.0f && size.y > 0.0f",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x3c14,
                        "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                       );
        }
        node->Pos = (this->DC).CursorPos;
        node->SizeRef = local_148;
        node->Size = local_148;
        uVar11 = (pIVar6->NextWindowData).Flags;
        (pIVar6->NextWindowData).Flags = uVar11 | 1;
        (pIVar6->NextWindowData).PosVal = node->Pos;
        (pIVar6->NextWindowData).PosPivotVal.x = 0.0;
        (pIVar6->NextWindowData).PosPivotVal.y = 0.0;
        (pIVar6->NextWindowData).PosCond = 1;
        (pIVar6->NextWindowData).PosUndock = true;
        (pIVar6->NextWindowData).Flags = uVar11 | 3;
        (pIVar6->NextWindowData).SizeVal = node->Size;
        (pIVar6->NextWindowData).SizeCond = 1;
        (ctx->NextWindowData).PosUndock = false;
        ImFormatString((char *)&local_138,0x100,"%s/DockSpace_%08X",this->Name,id);
        PushStyleVar(8,0.0);
        Begin((char *)&local_138,(bool *)0x0,0x210001bb);
        PopStyleVar(1);
        pIVar3 = ctx->CurrentWindow;
        pIVar4 = node->HostWindow;
        if ((pIVar4 != pIVar3 && pIVar4 != (ImGuiWindow *)0x0) && (pIVar4->DockNodeAsHost == node))
        {
          pIVar4->DockNodeAsHost = (ImGuiDockNode *)0x0;
        }
        pIVar3->DockNodeAsHost = node;
        node->HostWindow = pIVar3;
        IVar8 = ImGuiWindow::GetID(this,(char *)&local_138,(char *)0x0);
        pIVar3->ChildId = IVar8;
        node->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
        if (node->ParentNode != (ImGuiDockNode *)0x0) {
          __assert_fail("node->IsRootNode()",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x3c2f,
                        "ImGuiID ImGui::DockSpace(ImGuiID, const ImVec2 &, ImGuiDockNodeFlags, const ImGuiWindowClass *)"
                       );
        }
        if ((node->ChildNodes[0] == (ImGuiDockNode *)0x0) && ((node->MergedFlags & 0x800) == 0)) {
          uVar11 = node->LocalFlags | 0x800;
          node->LocalFlags = uVar11;
          node->MergedFlags = node->SharedFlags | node->LocalFlagsInWindows | uVar11;
        }
        DockNodeUpdate(node);
        End();
        ItemSize(&local_148,-1.0);
      }
      else {
        node->LastFrameAlive = iVar2;
      }
    }
  }
  return IVar9;
}

Assistant:

ImGuiID ImGui::DockSpace(ImGuiID id, const ImVec2& size_arg, ImGuiDockNodeFlags flags, const ImGuiWindowClass* window_class)
{
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;
    ImGuiWindow* window = GetCurrentWindow();
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return 0;

    // Early out if parent window is hidden/collapsed
    // This is faster but also DockNodeUpdateTabBar() relies on TabBarLayout() running (which won't if SkipItems=true) to set NextSelectedTabId = 0). See #2960.
    // If for whichever reason this is causing problem we would need to ensure that DockNodeUpdateTabBar() ends up clearing NextSelectedTabId even if SkipItems=true.
    if (window->SkipItems)
        flags |= ImGuiDockNodeFlags_KeepAliveOnly;

    IM_ASSERT((flags & ImGuiDockNodeFlags_DockSpace) == 0);
    IM_ASSERT(id != 0);
    ImGuiDockNode* node = DockContextFindNodeByID(ctx, id);
    if (!node)
    {
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X created\n", id);
        node = DockContextAddNode(ctx, id);
        node->SetLocalFlags(ImGuiDockNodeFlags_CentralNode);
    }
    if (window_class && window_class->ClassId != node->WindowClass.ClassId)
        IMGUI_DEBUG_LOG_DOCKING("DockSpace: dockspace node 0x%08X: setup WindowClass 0x%08X -> 0x%08X\n", id, node->WindowClass.ClassId, window_class->ClassId);
    node->SharedFlags = flags;
    node->WindowClass = window_class ? *window_class : ImGuiWindowClass();

    // When a DockSpace transitioned form implicit to explicit this may be called a second time
    // It is possible that the node has already been claimed by a docked window which appeared before the DockSpace() node, so we overwrite IsDockSpace again.
    if (node->LastFrameActive == g.FrameCount && !(flags & ImGuiDockNodeFlags_KeepAliveOnly))
    {
        IM_ASSERT(node->IsDockSpace() == false && "Cannot call DockSpace() twice a frame with the same ID");
        node->SetLocalFlags(node->LocalFlags | ImGuiDockNodeFlags_DockSpace);
        return id;
    }
    node->SetLocalFlags(node->LocalFlags | ImGuiDockNodeFlags_DockSpace);

    // Keep alive mode, this is allow windows docked into this node so stay docked even if they are not visible
    if (flags & ImGuiDockNodeFlags_KeepAliveOnly)
    {
        node->LastFrameAlive = g.FrameCount;
        return id;
    }

    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too much issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    IM_ASSERT(size.x > 0.0f && size.y > 0.0f);

    node->Pos = window->DC.CursorPos;
    node->Size = node->SizeRef = size;
    SetNextWindowPos(node->Pos);
    SetNextWindowSize(node->Size);
    g.NextWindowData.PosUndock = false;

    // FIXME-DOCK: Why do we need a child window to host a dockspace, could we host it in the existing window?
    // FIXME-DOCK: What is the reason for not simply calling BeginChild()? (OK to have a reason but should be commented)
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_DockNodeHost;
    window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoTitleBar;
    window_flags |= ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse;
    window_flags |= ImGuiWindowFlags_NoBackground;

    char title[256];
    ImFormatString(title, IM_ARRAYSIZE(title), "%s/DockSpace_%08X", window->Name, id);

    PushStyleVar(ImGuiStyleVar_ChildBorderSize, 0.0f);
    Begin(title, NULL, window_flags);
    PopStyleVar();

    ImGuiWindow* host_window = g.CurrentWindow;
    DockNodeSetupHostWindow(node, host_window);
    host_window->ChildId = window->GetID(title);
    node->OnlyNodeWithWindows = NULL;

    IM_ASSERT(node->IsRootNode());

    // We need to handle the rare case were a central node is missing.
    // This can happen if the node was first created manually with DockBuilderAddNode() but _without_ the ImGuiDockNodeFlags_Dockspace.
    // Doing it correctly would set the _CentralNode flags, which would then propagate according to subsequent split.
    // It would also be ambiguous to attempt to assign a central node while there are split nodes, so we wait until there's a single node remaining.
    // The specific sub-property of _CentralNode we are interested in recovering here is the "Don't delete when empty" property,
    // as it doesn't make sense for an empty dockspace to not have this property.
    if (node->IsLeafNode() && !node->IsCentralNode())
        node->SetLocalFlags(node->LocalFlags | ImGuiDockNodeFlags_CentralNode);

    // Update the node
    DockNodeUpdate(node);

    End();
    ItemSize(size);
    return id;
}